

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

bool spvtools::opt::anon_unknown_0::IsValidResult<double>(double val)

{
  uint uVar1;
  
  uVar1 = std::fpclassify(val);
  return (bool)(4U >> ((byte)uVar1 & 0xf) & 1 | 3 < uVar1);
}

Assistant:

bool IsValidResult(T val) {
  int classified = std::fpclassify(val);
  switch (classified) {
    case FP_NAN:
    case FP_INFINITE:
    case FP_SUBNORMAL:
      return false;
    default:
      return true;
  }
}